

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_16fac41::HandleReadElfCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  StringEntry *pSVar5;
  pointer ppVar6;
  pointer ppVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  string rpath;
  cmELF elf;
  Arguments arguments;
  undefined1 local_148 [24];
  _Any_data local_130;
  _Manager_type p_Stack_120;
  _Invoker_type local_118;
  char *pcStack_110;
  _Any_data local_108;
  _Manager_type local_f8;
  pointer ppStack_f0;
  pointer local_e8;
  pointer ppStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
    local_148._0_8_ = (ActionMap *)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,
               "READ_ELF must be called with at least three additional arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((ActionMap *)local_148._0_8_ != (ActionMap *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_,
                      (ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                     local_148._16_8_)->_M_len + 1));
    }
    bVar3 = false;
  }
  else {
    if (((anonymous_namespace)::
         HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar4 != 0)) {
      local_e8 = (pointer)0x0;
      ppStack_e0 = (pointer)0x0;
      local_f8 = (_Manager_type)0x0;
      ppStack_f0 = (pointer)0x0;
      local_108._0_8_ = 0;
      local_108._8_8_ = (_Manager_type)0x0;
      local_118 = (_Invoker_type)0x0;
      pcStack_110 = (char *)0x0;
      local_130._8_8_ = 0;
      p_Stack_120 = (_Manager_type)0x0;
      local_148._16_8_ = (pointer)0x0;
      local_130._M_unused._M_object = (void *)0x0;
      local_148._0_8_ = (ActionMap *)0x0;
      local_148._8_8_ = (pointer)0x0;
      name.super_string_view._M_str = "RPATH";
      name.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_148,name,0);
      name_00.super_string_view._M_str = "RUNPATH";
      name_00.super_string_view._M_len = 7;
      cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_148,name_00,0x20);
      name_01.super_string_view._M_str = "CAPTURE_ERROR";
      name_01.super_string_view._M_len = 0xd;
      cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_148,name_01,0x40);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleReadElfCommand::parser,(ActionMap *)local_148);
      ArgumentParser::Base::~Base((Base *)local_148);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleReadElfCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    local_d8._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_d8._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_148._0_8_ = &HandleReadElfCommand::parser;
    local_148._8_8_ = (pointer)0x0;
    local_148._16_8_ = (pointer)0x0;
    local_130._M_unused._M_object = &local_90;
    local_130._8_8_ = (pointer)0x0;
    p_Stack_120 = (_Manager_type)0x0;
    local_118 = (_Invoker_type)0x0;
    pcStack_110 = (char *)0x0;
    local_108._0_8_ = 0;
    local_108._8_8_ = (_Manager_type)0x0;
    local_f8 = (_Manager_type)0x0;
    ppStack_f0 = (pointer)0x0;
    local_e8 = (pointer)((ulong)local_e8 & 0xffffffffffffff00);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ArgumentParser::Instance::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Instance *)local_148,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_d8,0);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
    bVar3 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar3) {
      cmELF::cmELF((cmELF *)local_d8,pbVar1[1]._M_dataplus._M_p);
      bVar3 = cmELF::Valid((cmELF *)local_d8);
      if (bVar3) {
        if ((local_90._M_string_length != 0) &&
           (pSVar5 = cmELF::GetRPath((cmELF *)local_d8), pSVar5 != (StringEntry *)0x0)) {
          pcVar2 = (pSVar5->Value)._M_dataplus._M_p;
          local_148._0_8_ = (ActionMap *)(local_148 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_148,pcVar2,pcVar2 + (pSVar5->Value)._M_string_length);
          ppVar6 = (pointer)0x0;
          ppVar7 = ppVar6;
          if ((pointer)local_148._8_8_ != (pointer)0x0) {
            do {
              if (*(char *)((long)&(((Base *)local_148._0_8_)->Bindings).Keywords.
                                   super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                   .
                                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                   ._M_impl.super__Vector_impl_data + (long)&(ppVar6->first)._M_len)
                  == ':') {
                *(char *)((long)&(((Base *)local_148._0_8_)->Bindings).Keywords.
                                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                 .
                                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                 ._M_impl.super__Vector_impl_data + (long)&(ppVar6->first)._M_len) =
                     ';';
              }
              ppVar6 = (pointer)((long)&(ppVar6->first)._M_len + 1);
              ppVar7 = (pointer)local_148._8_8_;
            } while ((pointer)local_148._8_8_ != ppVar6);
          }
          value._M_str = (char *)local_148._0_8_;
          value._M_len = (size_t)ppVar7;
          cmMakefile::AddDefinition(status->Makefile,&local_90,value);
          if ((ActionMap *)local_148._0_8_ != (ActionMap *)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_,
                            (ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                           local_148._16_8_)->_M_len + 1));
          }
        }
        bVar3 = true;
        if ((local_70._M_string_length != 0) &&
           (pSVar5 = cmELF::GetRunPath((cmELF *)local_d8), pSVar5 != (StringEntry *)0x0)) {
          pcVar2 = (pSVar5->Value)._M_dataplus._M_p;
          local_148._0_8_ = (ActionMap *)(local_148 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_148,pcVar2,pcVar2 + (pSVar5->Value)._M_string_length);
          ppVar6 = (pointer)0x0;
          ppVar7 = ppVar6;
          if ((pointer)local_148._8_8_ != (pointer)0x0) {
            do {
              if (*(char *)((long)&(((Base *)local_148._0_8_)->Bindings).Keywords.
                                   super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                   .
                                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                   ._M_impl.super__Vector_impl_data + (long)&(ppVar6->first)._M_len)
                  == ':') {
                *(char *)((long)&(((Base *)local_148._0_8_)->Bindings).Keywords.
                                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                 .
                                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                 ._M_impl.super__Vector_impl_data + (long)&(ppVar6->first)._M_len) =
                     ';';
              }
              ppVar6 = (pointer)((long)&(ppVar6->first)._M_len + 1);
              ppVar7 = (pointer)local_148._8_8_;
            } while ((pointer)local_148._8_8_ != ppVar6);
          }
          value_00._M_str = (char *)local_148._0_8_;
          value_00._M_len = (size_t)ppVar7;
          cmMakefile::AddDefinition(status->Makefile,&local_70,value_00);
          if ((ActionMap *)local_148._0_8_ != (ActionMap *)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_,
                            (ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                           local_148._16_8_)->_M_len + 1));
          }
        }
      }
      else if (local_50._M_string_length == 0) {
        local_148._0_8_ = (ActionMap *)0x17;
        local_148._8_8_ = "READ_ELF given FILE:\n  ";
        local_148._16_8_ = (pointer)0x0;
        local_130._8_8_ = pbVar1[1]._M_dataplus._M_p;
        local_130._M_unused._0_8_ = (undefined8)pbVar1[1]._M_string_length;
        p_Stack_120 = (_Manager_type)0x0;
        local_118 = (_Invoker_type)&DAT_0000001e;
        pcStack_110 = "\nthat is not a valid ELF file.";
        local_108._0_8_ = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_148;
        cmCatViews((string *)(local_c8 + 0x18),views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._24_8_ != &local_a0) {
          operator_delete((void *)local_c8._24_8_,local_a0._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      else {
        bVar3 = true;
        value_01._M_str = "not a valid ELF file";
        value_01._M_len = 0x14;
        cmMakefile::AddDefinition(status->Makefile,&local_50,value_01);
      }
      cmELF::~cmELF((cmELF *)local_d8);
    }
    else {
      local_148._0_8_ = (ActionMap *)0x15;
      local_148._8_8_ = "READ_ELF given FILE \"";
      local_148._16_8_ = (pointer)0x0;
      local_130._8_8_ = pbVar1[1]._M_dataplus._M_p;
      local_130._M_unused._0_8_ = (undefined8)pbVar1[1]._M_string_length;
      p_Stack_120 = (_Manager_type)0x0;
      local_118 = (_Invoker_type)0x16;
      pcStack_110 = "\" that does not exist.";
      local_108._0_8_ = 0;
      views._M_len = 3;
      views._M_array = (iterator)local_148;
      cmCatViews((string *)local_d8,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((pointer)local_d8._0_8_ != (pointer)local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
      }
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool HandleReadElfCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("READ_ELF must be called with at least three additional "
                    "arguments.");
    return false;
  }

  std::string const& fileNameArg = args[1];

  struct Arguments
  {
    std::string RPath;
    std::string RunPath;
    std::string Error;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("RPATH"_s, &Arguments::RPath)
                               .Bind("RUNPATH"_s, &Arguments::RunPath)
                               .Bind("CAPTURE_ERROR"_s, &Arguments::Error);
  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(2),
                                           /*unparsedArguments=*/nullptr);

  if (!cmSystemTools::FileExists(fileNameArg, true)) {
    status.SetError(cmStrCat("READ_ELF given FILE \"", fileNameArg,
                             "\" that does not exist."));
    return false;
  }

  cmELF elf(fileNameArg.c_str());
  if (!elf) {
    if (arguments.Error.empty()) {
      status.SetError(cmStrCat("READ_ELF given FILE:\n  ", fileNameArg,
                               "\nthat is not a valid ELF file."));
      return false;
    }
    status.GetMakefile().AddDefinition(arguments.Error,
                                       "not a valid ELF file");
    return true;
  }

  if (!arguments.RPath.empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RPath, rpath);
    }
  }
  if (!arguments.RunPath.empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RunPath, runpath);
    }
  }

  return true;
}